

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O1

void __thiscall Alice::LoadNextShuffleVectors(Alice *this)

{
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *this_00;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *this_01;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *this_02;
  vector<long,std::allocator<long>> *pvVar1;
  iterator iVar2;
  long lVar3;
  int iVar4;
  undefined1 local_108 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  U;
  undefined1 local_c0 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  V;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  W;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  X;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  Y;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  Z;
  long local_38;
  long temp;
  
  if (LoadNextShuffleVectors()::upin == '\0') {
    iVar4 = __cxa_guard_acquire(&LoadNextShuffleVectors()::upin);
    if (iVar4 != 0) {
      std::ifstream::ifstream(LoadNextShuffleVectors()::upin,"../randoms/alice/U_PA.txt",_S_in);
      __cxa_atexit(std::ifstream::~ifstream,LoadNextShuffleVectors()::upin,&__dso_handle);
      __cxa_guard_release(&LoadNextShuffleVectors()::upin);
    }
  }
  if (LoadNextShuffleVectors()::udin == '\0') {
    iVar4 = __cxa_guard_acquire(&LoadNextShuffleVectors()::udin);
    if (iVar4 != 0) {
      std::ifstream::ifstream(LoadNextShuffleVectors()::udin,"../randoms/alice/U_DA.txt",_S_in);
      __cxa_atexit(std::ifstream::~ifstream,LoadNextShuffleVectors()::udin,&__dso_handle);
      __cxa_guard_release(&LoadNextShuffleVectors()::udin);
    }
  }
  if (LoadNextShuffleVectors()::rpin == '\0') {
    iVar4 = __cxa_guard_acquire(&LoadNextShuffleVectors()::rpin);
    if (iVar4 != 0) {
      std::ifstream::ifstream(LoadNextShuffleVectors()::rpin,"../randoms/alice/R_PA.txt",_S_in);
      __cxa_atexit(std::ifstream::~ifstream,LoadNextShuffleVectors()::rpin,&__dso_handle);
      __cxa_guard_release(&LoadNextShuffleVectors()::rpin);
    }
  }
  if (LoadNextShuffleVectors()::rdin == '\0') {
    iVar4 = __cxa_guard_acquire(&LoadNextShuffleVectors()::rdin);
    if (iVar4 != 0) {
      std::ifstream::ifstream(LoadNextShuffleVectors()::rdin,"../randoms/alice/R_DA.txt",_S_in);
      __cxa_atexit(std::ifstream::~ifstream,LoadNextShuffleVectors()::rdin,&__dso_handle);
      __cxa_guard_release(&LoadNextShuffleVectors()::rdin);
    }
  }
  if (LoadNextShuffleVectors()::pipin == '\0') {
    iVar4 = __cxa_guard_acquire(&LoadNextShuffleVectors()::pipin);
    if (iVar4 != 0) {
      std::ifstream::ifstream
                (LoadNextShuffleVectors()::pipin,"../randoms/alice/Pi_diff_R_PB_PA.txt",_S_in);
      __cxa_atexit(std::ifstream::~ifstream,LoadNextShuffleVectors()::pipin,&__dso_handle);
      __cxa_guard_release(&LoadNextShuffleVectors()::pipin);
    }
  }
  if (LoadNextShuffleVectors()::pidin == '\0') {
    iVar4 = __cxa_guard_acquire(&LoadNextShuffleVectors()::pidin);
    if (iVar4 != 0) {
      std::ifstream::ifstream
                (LoadNextShuffleVectors()::pidin,"../randoms/alice/Pi_diff_R_DB_DA.txt",_S_in);
      __cxa_atexit(std::ifstream::~ifstream,LoadNextShuffleVectors()::pidin,&__dso_handle);
      __cxa_guard_release(&LoadNextShuffleVectors()::pidin);
    }
  }
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)local_108,(long)(this->super_Party).n_p,(allocator_type *)local_c0);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)local_c0,(long)(this->super_Party).n_p,
           (allocator_type *)
           &V.
            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)&V.
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(this->super_Party).n_p,
           (allocator_type *)
           &W.
            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)&W.
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(this->super_Party).n_d,
           (allocator_type *)
           &X.
            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)&X.
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(this->super_Party).n_d,
           (allocator_type *)
           &Y.
            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)&Y.
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(this->super_Party).n_d,
           (allocator_type *)&local_38);
  U.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&(this->super_Party).U_P;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::_M_erase_at_end((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     *)U.
                       super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (this->super_Party).U_P.
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  this_00 = &(this->super_Party).U_D;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::_M_erase_at_end(this_00,(this->super_Party).U_D.
                            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  this_01 = &(this->super_Party).R_P;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::_M_erase_at_end(this_01,(this->super_Party).R_P.
                            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  this_02 = &(this->super_Party).R_D;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::_M_erase_at_end(this_02,(this->super_Party).R_D.
                            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::_M_erase_at_end(&this->Pi_P_diff_R_PB_R_PA,
                    (this->Pi_P_diff_R_PB_R_PA).
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::_M_erase_at_end(&this->Pi_D_diff_R_DB_R_DA,
                    (this->Pi_D_diff_R_DB_R_DA).
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  if (0 < (this->super_Party).n_p) {
    lVar3 = 0;
    do {
      iVar4 = 5;
      do {
        std::istream::_M_extract<long>((long *)LoadNextShuffleVectors()::upin);
        pvVar1 = (vector<long,std::allocator<long>> *)((long)local_108 + lVar3 * 0x18);
        iVar2._M_current = *(long **)(pvVar1 + 8);
        if (iVar2._M_current == *(long **)(pvVar1 + 0x10)) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    (pvVar1,iVar2,&local_38);
        }
        else {
          *iVar2._M_current = local_38;
          *(long **)(pvVar1 + 8) = iVar2._M_current + 1;
        }
        std::istream::_M_extract<long>((long *)LoadNextShuffleVectors()::rpin);
        pvVar1 = (vector<long,std::allocator<long>> *)((long)local_c0 + lVar3 * 0x18);
        iVar2._M_current = *(long **)(pvVar1 + 8);
        if (iVar2._M_current == *(long **)(pvVar1 + 0x10)) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    (pvVar1,iVar2,&local_38);
        }
        else {
          *iVar2._M_current = local_38;
          *(long **)(pvVar1 + 8) = iVar2._M_current + 1;
        }
        std::istream::_M_extract<long>((long *)LoadNextShuffleVectors()::pipin);
        pvVar1 = (vector<long,std::allocator<long>> *)
                 (V.
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar3);
        iVar2._M_current = *(long **)(pvVar1 + 8);
        if (iVar2._M_current == *(long **)(pvVar1 + 0x10)) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    (pvVar1,iVar2,&local_38);
        }
        else {
          *iVar2._M_current = local_38;
          *(long **)(pvVar1 + 8) = iVar2._M_current + 1;
        }
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->super_Party).n_p);
  }
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  _M_assign_aux<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)U.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,local_108,
             U.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  _M_assign_aux<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)this_01,local_c0,
             V.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  _M_assign_aux<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)&this->Pi_P_diff_R_PB_R_PA,
             V.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             W.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (0 < (this->super_Party).n_d) {
    lVar3 = 0;
    do {
      iVar4 = 1;
      do {
        std::istream::_M_extract<long>((long *)LoadNextShuffleVectors()::udin);
        pvVar1 = (vector<long,std::allocator<long>> *)
                 (W.
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar3);
        iVar2._M_current = *(long **)(pvVar1 + 8);
        if (iVar2._M_current == *(long **)(pvVar1 + 0x10)) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    (pvVar1,iVar2,&local_38);
        }
        else {
          *iVar2._M_current = local_38;
          *(long **)(pvVar1 + 8) = iVar2._M_current + 1;
        }
        std::istream::_M_extract<long>((long *)LoadNextShuffleVectors()::rdin);
        pvVar1 = (vector<long,std::allocator<long>> *)
                 (X.
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar3);
        iVar2._M_current = *(long **)(pvVar1 + 8);
        if (iVar2._M_current == *(long **)(pvVar1 + 0x10)) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    (pvVar1,iVar2,&local_38);
        }
        else {
          *iVar2._M_current = local_38;
          *(long **)(pvVar1 + 8) = iVar2._M_current + 1;
        }
        std::istream::_M_extract<long>((long *)LoadNextShuffleVectors()::pidin);
        pvVar1 = (vector<long,std::allocator<long>> *)
                 (Y.
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar3);
        iVar2._M_current = *(long **)(pvVar1 + 8);
        if (iVar2._M_current == *(long **)(pvVar1 + 0x10)) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    (pvVar1,iVar2,&local_38);
        }
        else {
          *iVar2._M_current = local_38;
          *(long **)(pvVar1 + 8) = iVar2._M_current + 1;
        }
        iVar4 = iVar4 + -1;
      } while (iVar4 == 0);
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->super_Party).n_d);
  }
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  _M_assign_aux<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)this_00,
             W.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             X.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  _M_assign_aux<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)this_02,
             X.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             Y.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  _M_assign_aux<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)&this->Pi_D_diff_R_DB_R_DA,
             Y.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             Z.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)&Y.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)&X.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)&W.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)&V.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)local_c0);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)local_108);
  return;
}

Assistant:

void Alice::LoadNextShuffleVectors()
{
    static std::ifstream upin("../randoms/alice/U_PA.txt");
    static std::ifstream udin("../randoms/alice/U_DA.txt");
    static std::ifstream rpin("../randoms/alice/R_PA.txt");
    static std::ifstream rdin("../randoms/alice/R_DA.txt");
    static std::ifstream pipin("../randoms/alice/Pi_diff_R_PB_PA.txt");
    static std::ifstream pidin("../randoms/alice/Pi_diff_R_DB_DA.txt");
    std::vector<std::vector<long>> U(n_p);
    std::vector<std::vector<long>> V(n_p);
    std::vector<std::vector<long>> W(n_p);
    std::vector<std::vector<long>> X(n_d);
    std::vector<std::vector<long>> Y(n_d);
    std::vector<std::vector<long>> Z(n_d);
    long temp;
    U_P.clear();
    U_D.clear();
    R_P.clear();
    R_D.clear();
    Pi_P_diff_R_PB_R_PA.clear();
    Pi_D_diff_R_DB_R_DA.clear();
    for (int i = 0; i < n_p; i++)
    {
        for (int j = 0; j < 5; j++)
        {
            upin >> temp;
            U[i].push_back(temp);
            rpin >> temp;
            V[i].push_back(temp);
            pipin >> temp;
            W[i].push_back(temp);
        }
    }
    U_P.assign(U.begin(), U.end());
    R_P.assign(V.begin(), V.end());
    Pi_P_diff_R_PB_R_PA.assign(W.begin(), W.end());
    for (int i = 0; i < n_d; i++)
    {
        for (int j = 0; j < 2; j++)
        {
            udin >> temp;
            X[i].push_back(temp);
            rdin >> temp;
            Y[i].push_back(temp);
            pidin >> temp;
            Z[i].push_back(temp);
        }
    }
    U_D.assign(X.begin(), X.end());
    R_D.assign(Y.begin(), Y.end());
    Pi_D_diff_R_DB_R_DA.assign(Z.begin(), Z.end());
}